

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O2

void dec_vproc_clr_prev1(MppDecVprocCtxImpl *ctx)

{
  MppFrame s;
  uint uVar1;
  RK_U32 RVar2;
  MppBuffer pvVar3;
  ulong uVar4;
  
  if (((byte)vproc_debug & 2) != 0) {
    if (ctx->prev_frm1 == (MppFrame)0x0) {
      _mpp_log_l(4,"mpp_dec_vproc","clearing nothing\n",(char *)0x0);
    }
    else {
      pvVar3 = mpp_frame_get_buffer(ctx->prev_frm1);
      if (pvVar3 == (MppBuffer)0x0) {
        uVar4 = 0xffffffffffffffff;
      }
      else {
        uVar1 = mpp_buffer_get_fd_with_caller(pvVar3,"dec_vproc_clr_prev1");
        uVar4 = (ulong)uVar1;
      }
      uVar1 = ctx->prev_idx1;
      s = ctx->prev_frm1;
      RVar2 = mpp_frame_get_poc(s);
      _mpp_log_l(4,"mpp_dec_vproc","clearing prev index %d frm %p fd %d, poc %d\n",(char *)0x0,
                 (ulong)uVar1,s,uVar4,(ulong)RVar2);
    }
  }
  if (ctx->prev_frm1 != (MppFrame)0x0) {
    pvVar3 = mpp_frame_get_buffer(ctx->prev_frm1);
    if (pvVar3 != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(pvVar3,"dec_vproc_clr_prev1");
    }
  }
  if (-1 < ctx->prev_idx1) {
    mpp_buf_slot_clr_flag(ctx->slots,ctx->prev_idx1,SLOT_QUEUE_USE);
  }
  ctx->prev_idx1 = -1;
  ctx->prev_frm1 = (MppFrame)0x0;
  return;
}

Assistant:

static void dec_vproc_clr_prev1(MppDecVprocCtxImpl *ctx)
{
    if (vproc_debug & VPROC_DBG_STATUS) {
        if (ctx->prev_frm1) {
            MppBuffer buf = mpp_frame_get_buffer(ctx->prev_frm1);
            RK_S32 fd = (buf) ? (mpp_buffer_get_fd(buf)) : (-1);
            mpp_log("clearing prev index %d frm %p fd %d, poc %d\n", ctx->prev_idx1,
                    ctx->prev_frm1, fd, mpp_frame_get_poc(ctx->prev_frm1));
        } else
            mpp_log("clearing nothing\n");
    }
    if (ctx->prev_frm1) {
        MppBuffer buf = mpp_frame_get_buffer(ctx->prev_frm1);
        if (buf)
            mpp_buffer_put(buf);
    }
    if (ctx->prev_idx1 >= 0)
        mpp_buf_slot_clr_flag(ctx->slots, ctx->prev_idx1, SLOT_QUEUE_USE);

    ctx->prev_idx1 = -1;
    ctx->prev_frm1 = NULL;
}